

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O0

void __thiscall QDoubleSpinBox::setPrefix(QDoubleSpinBox *this,QString *prefix)

{
  long lVar1;
  QDoubleSpinBoxPrivate *this_00;
  QString *in_RSI;
  long in_FS_OFFSET;
  QDoubleSpinBoxPrivate *d;
  QSize local_18;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QDoubleSpinBox *)0x6921be);
  QString::operator=(&(this_00->super_QAbstractSpinBoxPrivate).prefix,in_RSI);
  (**(code **)(*(long *)&(this_00->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0xc0))();
  QSize::QSize((QSize *)this_00);
  (this_00->super_QAbstractSpinBoxPrivate).cachedSizeHint = local_10;
  QSize::QSize((QSize *)this_00);
  (this_00->super_QAbstractSpinBoxPrivate).cachedMinimumSizeHint = local_18;
  QWidget::updateGeometry((QWidget *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDoubleSpinBox::setPrefix(const QString &prefix)
{
    Q_D(QDoubleSpinBox);

    d->prefix = prefix;
    d->updateEdit();

    d->cachedSizeHint = QSize();
    d->cachedMinimumSizeHint = QSize(); // minimumSizeHint cares about the prefix
    updateGeometry();
}